

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void Int2StrConvert<unsigned_short>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  ostream *poVar10;
  ulong uVar11;
  char *pcVar12;
  unsigned_short i;
  ulong x;
  byte local_78;
  char local_77;
  char local_76;
  char local_75 [5];
  char buf [64];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pcVar12 = _endl<char,std::char_traits<char>> + (*_endl<char,std::char_traits<char>> == '*');
  sVar8 = strlen(pcVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int2str::convert",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  buf._56_8_ = std::chrono::_V2::steady_clock::now();
  x = 0;
  do {
    uVar11 = (x >> 2) / 0x19;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = x + uVar11 * -100;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = x;
    if (x < 0x100) {
      cVar6 = (char)x;
      if (x < 100) {
        if (x < 10) {
          local_78 = cVar6 + 0x30;
          pcVar12 = &local_77;
        }
        else {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = x;
          local_78 = (byte)(SUB164(auVar4 * ZEXT816(0xcccccccccccccccd),8) >> 3) | 0x30;
          local_77 = ((byte)(SUB164(auVar2 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 + '0'
                     + cVar6;
          pcVar12 = &local_76;
        }
      }
      else {
        local_76 = (char)uVar11 * -100 + '0';
        auVar3._8_8_ = 0;
        auVar3._0_8_ = x >> 2;
        local_78 = (byte)(SUB164(auVar3 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) | 0x30;
        uVar11 = uVar11 * -100 + x;
        if (uVar11 < 10) {
          local_77 = '0';
          local_76 = local_76 + cVar6;
        }
        else {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar11;
          local_77 = (char)(SUB164(auVar5 * ZEXT816(0xcccccccccccccccd),8) >> 3) + '0';
          local_76 = local_76 + cVar6 + SUB161(auVar1 * ZEXT816(0x199999999999999a),8) * -10;
        }
        pcVar12 = local_75;
      }
    }
    else {
      pcVar12 = int2str::impl::detail<10000ull>::convert<char*>(x,(char *)&local_78);
    }
    *pcVar12 = '\0';
    x = x + 1;
  } while (x != 0xffff);
  lVar9 = std::chrono::_V2::steady_clock::now();
  lVar7 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar7 + -0x18)) = 3;
  poVar10 = std::ostream::_M_insert<double>((double)(lVar9 - buf._56_8_) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  return;
}

Assistant:

void Int2StrConvert()
{
#ifdef _MSC_VER  
    static char buf[64];
#else
    char buf[64];
#endif
    PROFILING_BEGIN(T, "int2str::convert")
    int2str::convert_with_zero(i, buf);
    PROFILING_END()
}